

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_ml_prune_4_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int part_ctx,int64_t best_rd,
               PartitionSearchState *part_state,int *part4_allowed,uint pb_source_variance)

{
  BLOCK_SIZE bsize;
  byte bVar1;
  uint8_t *puVar2;
  ExtPartController *ext_part_controller;
  _Bool _Var3;
  int i;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  NN_CONFIG *pNVar7;
  undefined4 *puVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  BLOCK_SIZE BVar16;
  uint8_t *puVar17;
  int iVar18;
  BLOCK_SIZE BVar19;
  bool bVar20;
  uint uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar37;
  uint vert_4_source_var [4];
  uint horz_4_source_var [4];
  int int_score [4];
  float score [4];
  int sub_block_rdcost [8];
  float features [18];
  int in_stack_ffffffffffffd3b8;
  int in_stack_ffffffffffffd3c0;
  uint local_2bf8 [8];
  buf_2d local_2bd8;
  ExtPartController *local_2bb0;
  PartitionSearchState *local_2ba8;
  int64_t local_2ba0;
  undefined1 local_2b98 [8];
  undefined8 uStack_2b90;
  int local_2b80;
  undefined1 local_2b78 [556];
  undefined1 local_294c [16];
  undefined1 local_2078 [56];
  undefined1 local_2040 [16];
  int local_3c;
  int iStack_38;
  
  iVar10 = (part_state->part_blk_params).mi_row;
  iVar18 = (part_state->part_blk_params).mi_col;
  bsize = (part_state->part_blk_params).bsize;
  uVar13 = (ulong)bsize;
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     ((cpi->ext_part_controller).ready == 0)) {
    _Var3 = false;
  }
  else {
    local_2b78._500_4_ = (undefined4)part_ctx;
    local_2b78._0_4_ = AOM_EXT_PART_FEATURE_AFTER_AB;
    uVar5 = 0x1f;
    if (pb_source_variance != 0) {
      for (; pb_source_variance >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    iVar4 = (uVar5 ^ 0xffffffe0) + 0x21;
    if (pb_source_variance == 0) {
      iVar4 = 0;
    }
    local_2b78._504_4_ = (undefined4)iVar4;
    local_2078._16_4_ = 0;
    local_2078._20_4_ = 0;
    local_2078._24_4_ = 0;
    local_2078._28_4_ = 0;
    local_2078._0_4_ = 0;
    local_2078._4_4_ = 0;
    local_2078._8_4_ = 0;
    local_2078._12_4_ = 0;
    lVar15 = 0;
    puVar8 = (undefined4 *)local_2078;
    bVar20 = true;
    do {
      bVar9 = bVar20;
      lVar15 = part_state->rect_part_rd[0][lVar15];
      if (lVar15 - 1U < 999999999) {
        *puVar8 = (int)lVar15;
      }
      lVar15 = 1;
      puVar8 = (undefined4 *)(local_2078 + 4);
      bVar20 = false;
    } while (bVar9);
    lVar15 = 2;
    lVar11 = 0;
    do {
      lVar11 = part_state->rect_part_rd[1][lVar11];
      if (lVar11 - 1U < 999999999) {
        *(int *)(local_2078 + lVar15 * 4) = (int)lVar11;
      }
      lVar15 = lVar15 + 1;
      lVar11 = 1;
    } while (lVar15 != 4);
    lVar15 = 0;
    do {
      if (part_state->split_rd[lVar15] - 1U < 999999999) {
        *(int *)(local_2078 + lVar15 * 4 + 0x10) = (int)part_state->split_rd[lVar15];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    iVar6 = 0x7fffffff;
    if (best_rd < 0x7fffffff) {
      iVar6 = best_rd;
    }
    iVar4 = (int)iVar6;
    auVar26._0_4_ = (float)iVar4;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    lVar15 = 0;
    do {
      lVar11 = lVar15 * 4;
      uVar5 = *(uint *)(local_2078 + lVar11);
      uVar24 = *(uint *)(local_2078 + lVar11 + 4);
      uVar28 = *(uint *)(local_2078 + lVar11 + 8);
      uVar29 = *(uint *)(local_2078 + lVar11 + 0xc);
      uVar30 = -(uint)((int)uVar5 < iVar4 && 0 < (int)uVar5);
      uVar31 = -(uint)((int)uVar24 < iVar4 && 0 < (int)uVar24);
      uVar36 = -(uint)((int)uVar28 < iVar4 && 0 < (int)uVar28);
      uVar37 = -(uint)((int)uVar29 < iVar4 && 0 < (int)uVar29);
      auVar32._0_4_ =
           ((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar5 & 0xffff | 0x4b000000);
      auVar32._4_4_ =
           ((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar24 & 0xffff | 0x4b000000);
      auVar32._8_4_ =
           ((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar28 & 0xffff | 0x4b000000);
      auVar32._12_4_ =
           ((float)(uVar29 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar29 & 0xffff | 0x4b000000);
      auVar32 = divps(auVar32,auVar26);
      lVar11 = lVar15 * 4;
      *(uint *)(local_294c + lVar11 + -0x30) = ~uVar30 & 0x3f800000 | auVar32._0_4_ & uVar30;
      *(uint *)(local_294c + lVar11 + -0x2c) = ~uVar31 & 0x3f800000 | auVar32._4_4_ & uVar31;
      *(uint *)(local_294c + lVar11 + -0x28) = ~uVar36 & 0x3f800000 | auVar32._8_4_ & uVar36;
      *(uint *)(local_294c + lVar11 + -0x24) = ~uVar37 & 0x3f800000 | auVar32._12_4_ & uVar37;
      lVar15 = lVar15 + 4;
    } while (lVar15 != 8);
    local_2bf8[4] = 0;
    local_2bf8[5] = 0;
    local_2bf8[6] = 0;
    local_2bf8[7] = 0;
    local_2bf8[0] = 0;
    local_2bf8[1] = 0;
    local_2bf8[2] = 0;
    local_2bf8[3] = 0;
    BVar16 = BLOCK_INVALID;
    uVar12 = uVar13;
    switch(uVar13) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001ed8f6_caseD_1;
    case 3:
      uVar12 = 1;
      break;
    case 6:
      uVar12 = 2;
      break;
    case 9:
      uVar12 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar12 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001ed8f6_caseD_1;
        uVar12 = 5;
      }
    }
    BVar16 = subsize_lookup[8][uVar12];
switchD_001ed8f6_caseD_1:
    BVar19 = BLOCK_INVALID;
    uVar12 = uVar13;
    switch(uVar13) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001ed95f_caseD_1;
    case 3:
      uVar12 = 1;
      break;
    case 6:
      uVar12 = 2;
      break;
    case 9:
      uVar12 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar12 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001ed95f_caseD_1;
        uVar12 = 5;
      }
    }
    BVar19 = subsize_lookup[9][uVar12];
switchD_001ed95f_caseD_1:
    bVar20 = ((cpi->common).seq_params)->monochrome == '\0';
    local_2bb0 = &cpi->ext_part_controller;
    local_2ba8 = part_state;
    local_2ba0 = best_rd;
    av1_setup_src_planes(x,cpi->source,iVar10,iVar18,bVar20 + 1 + (uint)bVar20,bsize);
    local_2bd8.stride = x->plane[0].src.stride;
    puVar2 = x->plane[0].src.buf;
    iVar4 = (uint)block_size_high[BVar16] * local_2bd8.stride;
    bVar1 = block_size_wide[BVar19];
    iVar14 = 0;
    lVar15 = 0;
    puVar17 = puVar2;
    local_2b80 = local_2bd8.stride;
    do {
      local_2b98 = (undefined1  [8])(puVar2 + iVar14);
      local_2bd8.buf = puVar17;
      uVar5 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)local_2b98,BVar16,0);
      local_2bf8[lVar15 + 4] = uVar5;
      uVar5 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&local_2bd8,BVar19,0);
      ext_part_controller = local_2bb0;
      local_2bf8[lVar15] = uVar5;
      lVar15 = lVar15 + 1;
      puVar17 = puVar17 + bVar1;
      iVar14 = iVar14 + iVar4;
    } while (lVar15 != 4);
    auVar21._0_4_ = (float)(pb_source_variance + 1);
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar25._0_4_ =
         ((float)(local_2bf8[4] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[4] + 1 & 0xffff | 0x4b000000);
    auVar25._4_4_ =
         ((float)(local_2bf8[5] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[5] + 1 & 0xffff | 0x4b000000);
    auVar25._8_4_ =
         ((float)(local_2bf8[6] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[6] + 1 & 0xffff | 0x4b000000);
    auVar25._12_4_ =
         ((float)(local_2bf8[7] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[7] + 1 & 0xffff | 0x4b000000);
    auVar26 = divps(auVar25,auVar21);
    auVar26 = maxps(_DAT_004fc4e0,auVar26);
    local_2b78._540_16_ = minps(_DAT_004fc4f0,auVar26);
    auVar33._0_4_ =
         ((float)(local_2bf8[0] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[0] + 1 & 0xffff | 0x4b000000);
    auVar33._4_4_ =
         ((float)(local_2bf8[1] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[1] + 1 & 0xffff | 0x4b000000);
    auVar33._8_4_ =
         ((float)(local_2bf8[2] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[2] + 1 & 0xffff | 0x4b000000);
    auVar33._12_4_ =
         ((float)(local_2bf8[3] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_2bf8[3] + 1 & 0xffff | 0x4b000000);
    auVar26 = divps(auVar33,auVar21);
    auVar26 = maxps(_DAT_004fc4e0,auVar26);
    local_294c = minps(_DAT_004fc4f0,auVar26);
    av1_ext_part_send_features(local_2bb0,(aom_partition_features_t *)local_2b78);
    _Var3 = av1_ext_part_get_partition_decision
                      (ext_part_controller,(aom_partition_decision_t *)local_2078);
    part_state = local_2ba8;
    best_rd = local_2ba0;
    if (_Var3) {
      part4_allowed[0] = local_3c;
      part4_allowed[1] = iStack_38;
    }
  }
  if (999999999 < best_rd || _Var3 != false) {
    return;
  }
  if (uVar13 == 6) {
    pNVar7 = &av1_4_partition_nnconfig_16;
  }
  else if (bsize == BLOCK_64X64) {
    pNVar7 = &av1_4_partition_nnconfig_64;
  }
  else {
    if (bsize != BLOCK_32X32) {
      return;
    }
    pNVar7 = &av1_4_partition_nnconfig_32;
  }
  uVar5 = 0x1f;
  if (pb_source_variance != 0) {
    for (; pb_source_variance >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  iVar4 = (uVar5 ^ 0xffffffe0) + 0x21;
  if (pb_source_variance == 0) {
    iVar4 = 0;
  }
  local_2078._4_4_ = (float)iVar4;
  local_2078._0_4_ = (float)part_ctx;
  local_2b78._16_4_ = 0.0;
  local_2b78._20_4_ = 0.0;
  local_2b78._24_4_ = 0.0;
  local_2b78._28_4_ = 0.0;
  local_2b78._0_4_ = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  local_2b78._4_4_ = 0.0;
  local_2b78._8_4_ = 0.0;
  local_2b78._12_4_ = 0.0;
  lVar15 = 0;
  puVar8 = (undefined4 *)local_2b78;
  bVar20 = true;
  do {
    bVar9 = bVar20;
    lVar15 = part_state->rect_part_rd[0][lVar15];
    if (lVar15 - 1U < 999999999) {
      *puVar8 = (int)lVar15;
    }
    lVar15 = 1;
    puVar8 = (undefined4 *)(local_2b78 + 4);
    bVar20 = false;
  } while (bVar9);
  puVar8 = (undefined4 *)(local_2b78 + 8);
  lVar15 = 0;
  bVar20 = true;
  do {
    bVar9 = bVar20;
    lVar15 = part_state->rect_part_rd[1][lVar15];
    if (lVar15 - 1U < 999999999) {
      *puVar8 = (int)lVar15;
    }
    puVar8 = puVar8 + 1;
    lVar15 = 1;
    bVar20 = false;
  } while (bVar9);
  lVar15 = 0;
  do {
    if (part_state->split_rd[lVar15] - 1U < 999999999) {
      *(int *)(local_2b78 + lVar15 * 4 + 0x10) = (int)part_state->split_rd[lVar15];
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  iVar4 = (int)best_rd;
  auVar22._0_4_ = (float)iVar4;
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  lVar15 = 0;
  do {
    lVar11 = lVar15 * 4;
    uVar5 = *(uint *)(local_2b78 + lVar11);
    uVar24 = *(uint *)(local_2b78 + lVar11 + 4);
    uVar28 = *(uint *)(local_2b78 + lVar11 + 8);
    uVar29 = *(uint *)(local_2b78 + lVar11 + 0xc);
    uVar30 = -(uint)((int)uVar5 < iVar4 && 0 < (int)uVar5);
    uVar31 = -(uint)((int)uVar24 < iVar4 && 0 < (int)uVar24);
    uVar36 = -(uint)((int)uVar28 < iVar4 && 0 < (int)uVar28);
    uVar37 = -(uint)((int)uVar29 < iVar4 && 0 < (int)uVar29);
    auVar34._0_4_ =
         ((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar5 & 0xffff | 0x4b000000)
    ;
    auVar34._4_4_ =
         ((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar24 & 0xffff | 0x4b000000);
    auVar34._8_4_ =
         ((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar28 & 0xffff | 0x4b000000);
    auVar34._12_4_ =
         ((float)(uVar29 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar29 & 0xffff | 0x4b000000);
    auVar26 = divps(auVar34,auVar22);
    lVar11 = lVar15 * 4;
    *(uint *)(local_2078 + lVar11 + 8) = ~uVar30 & 0x3f800000 | auVar26._0_4_ & uVar30;
    *(uint *)(local_2078 + lVar11 + 0xc) = ~uVar31 & 0x3f800000 | auVar26._4_4_ & uVar31;
    *(uint *)(local_2078 + lVar11 + 0x10) = ~uVar36 & 0x3f800000 | auVar26._8_4_ & uVar36;
    *(uint *)(local_2078 + lVar11 + 0x14) = ~uVar37 & 0x3f800000 | auVar26._12_4_ & uVar37;
    lVar15 = lVar15 + 4;
  } while (lVar15 != 8);
  local_2bf8[4] = 0;
  local_2bf8[5] = 0;
  local_2bf8[6] = 0;
  local_2bf8[7] = 0;
  local_2bf8[0] = 0;
  local_2bf8[1] = 0;
  local_2bf8[2] = 0;
  local_2bf8[3] = 0;
  BVar16 = BLOCK_INVALID;
  uVar12 = uVar13;
  switch(uVar13) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001edd8c_caseD_1;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001edd8c_caseD_1;
      uVar12 = 5;
    }
  }
  BVar16 = subsize_lookup[8][uVar12];
switchD_001edd8c_caseD_1:
  BVar19 = BLOCK_INVALID;
  switch(uVar13) {
  case 0:
    uVar12 = uVar13;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001eddde_caseD_1;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001eddde_caseD_1;
      uVar12 = 5;
    }
  }
  BVar19 = subsize_lookup[9][uVar12];
switchD_001eddde_caseD_1:
  bVar20 = ((cpi->common).seq_params)->monochrome == '\0';
  av1_setup_src_planes(x,cpi->source,iVar10,iVar18,bVar20 + 1 + (uint)bVar20,bsize);
  local_2bd8.stride = x->plane[0].src.stride;
  puVar2 = x->plane[0].src.buf;
  iVar10 = (uint)block_size_high[BVar16] * local_2bd8.stride;
  bVar1 = block_size_wide[BVar19];
  iVar18 = 0;
  lVar15 = 0;
  puVar17 = puVar2;
  local_2b80 = local_2bd8.stride;
  do {
    local_2b98 = (undefined1  [8])(puVar2 + iVar18);
    local_2bd8.buf = puVar17;
    uVar5 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)local_2b98,BVar16,0);
    local_2bf8[lVar15 + 4] = uVar5;
    uVar5 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&local_2bd8,BVar19,0);
    local_2bf8[lVar15] = uVar5;
    lVar15 = lVar15 + 1;
    puVar17 = puVar17 + bVar1;
    iVar18 = iVar18 + iVar10;
  } while (lVar15 != 4);
  auVar23._0_4_ = (float)(pb_source_variance + 1);
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  auVar27._0_4_ =
       ((float)(local_2bf8[4] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[4] + 1 & 0xffff | 0x4b000000);
  auVar27._4_4_ =
       ((float)(local_2bf8[5] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[5] + 1 & 0xffff | 0x4b000000);
  auVar27._8_4_ =
       ((float)(local_2bf8[6] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[6] + 1 & 0xffff | 0x4b000000);
  auVar27._12_4_ =
       ((float)(local_2bf8[7] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[7] + 1 & 0xffff | 0x4b000000);
  auVar26 = divps(auVar27,auVar23);
  auVar26 = maxps(_DAT_004fc4e0,auVar26);
  local_2078._40_16_ = minps(_DAT_004fc4f0,auVar26);
  auVar35._0_4_ =
       ((float)(local_2bf8[0] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[0] + 1 & 0xffff | 0x4b000000);
  auVar35._4_4_ =
       ((float)(local_2bf8[1] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[1] + 1 & 0xffff | 0x4b000000);
  auVar35._8_4_ =
       ((float)(local_2bf8[2] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[2] + 1 & 0xffff | 0x4b000000);
  auVar35._12_4_ =
       ((float)(local_2bf8[3] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[3] + 1 & 0xffff | 0x4b000000);
  auVar26 = divps(auVar35,auVar23);
  auVar26 = maxps(_DAT_004fc4e0,auVar26);
  local_2040 = minps(_DAT_004fc4f0,auVar26);
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    write_features_to_file
              ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
               (float *)local_2078,0x12,7,(BLOCK_SIZE)uVar13,in_stack_ffffffffffffd3b8,
               in_stack_ffffffffffffd3c0);
  }
  local_2b98 = (undefined1  [8])0x0;
  uStack_2b90 = (uint8_t *)0x0;
  (*av1_nn_predict)((float *)local_2078,pNVar7,1,(float *)local_2b98);
  uVar5 = (uint)((float)local_2b98._0_4_ * 100.0);
  uVar24 = (uint)((float)local_2b98._4_4_ * 100.0);
  local_2bd8.buf0._0_4_ = (uint)((float)uStack_2b90 * 100.0);
  local_2bd8.buf0._4_4_ = (uint)(uStack_2b90._4_4_ * 100.0);
  local_2bd8.buf = (uint8_t *)CONCAT44(uVar24,uVar5);
  uVar28 = ~-(uint)(-1000 < (int)uVar5) & 0xfffffc18 | uVar5 & -(uint)(-1000 < (int)uVar5);
  uVar29 = ~-(uint)(-1000 < (int)uVar24) & 0xfffffc18 | uVar24 & -(uint)(-1000 < (int)uVar24);
  uVar30 = ~-(uint)(-1000 < (int)(uint)local_2bd8.buf0) & 0xfffffc18 |
           (uint)local_2bd8.buf0 & -(uint)(-1000 < (int)(uint)local_2bd8.buf0);
  uVar31 = ~-(uint)(-1000 < (int)local_2bd8.buf0._4_4_) & 0xfffffc18 |
           local_2bd8.buf0._4_4_ & -(uint)(-1000 < (int)local_2bd8.buf0._4_4_);
  uVar5 = -(uint)((int)uVar30 < (int)uVar28);
  uVar24 = -(uint)((int)uVar31 < (int)uVar29);
  uVar5 = ~uVar5 & uVar30 | uVar28 & uVar5;
  uVar24 = ~uVar24 & uVar31 | uVar29 & uVar24;
  uVar28 = -(uint)((int)uVar24 < (int)uVar5);
  uVar5 = ~uVar28 & uVar24 | uVar5 & uVar28;
  if (bsize == BLOCK_64X64) {
    uVar5 = uVar5 - 200;
  }
  else if ((bsize == BLOCK_32X32) || (bsize == BLOCK_16X16)) {
    uVar5 = uVar5 - 500;
  }
  part4_allowed[0] = 0;
  part4_allowed[1] = 0;
  uVar13 = 0;
  do {
    if ((int)uVar5 <= *(int *)((long)&local_2bd8.buf + uVar13 * 4)) {
      if ((uVar13 & 1) != 0) {
        *part4_allowed = 1;
      }
      if (1 < uVar13) {
        part4_allowed[1] = 1;
      }
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  return;
}

Assistant:

void av1_ml_prune_4_partition(AV1_COMP *const cpi, MACROBLOCK *const x,
                              int part_ctx, int64_t best_rd,
                              PartitionSearchState *part_state,
                              int *part4_allowed,
                              unsigned int pb_source_variance) {
  const PartitionBlkParams blk_params = part_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  int64_t(*rect_part_rd)[SUB_PARTITIONS_RECT] = part_state->rect_part_rd;
  int64_t *split_rd = part_state->split_rd;
  if (ext_ml_model_decision_after_part_ab(
          cpi, x, bsize, part_ctx, best_rd, rect_part_rd, split_rd,
          &part4_allowed[HORZ4], &part4_allowed[VERT4], pb_source_variance,
          mi_row, mi_col))
    return;

  if (best_rd >= 1000000000) return;
  int64_t *horz_rd = rect_part_rd[HORZ4];
  int64_t *vert_rd = rect_part_rd[VERT4];
  const NN_CONFIG *nn_config = NULL;
  // 4-way partitions are only allowed for these three square block sizes.
  switch (bsize) {
    case BLOCK_16X16: nn_config = &av1_4_partition_nnconfig_16; break;
    case BLOCK_32X32: nn_config = &av1_4_partition_nnconfig_32; break;
    case BLOCK_64X64: nn_config = &av1_4_partition_nnconfig_64; break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // Generate features.
  float features[FEATURES];
  int feature_index = 0;
  features[feature_index++] = (float)part_ctx;
  features[feature_index++] = (float)get_unsigned_bits(pb_source_variance);

  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features[feature_index++] = rd_ratio;
  }

  // Get variance of the 1:4 and 4:1 sub-blocks.
  unsigned int horz_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  unsigned int vert_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  {
    BLOCK_SIZE horz_4_bs = get_partition_subsize(bsize, PARTITION_HORZ_4);
    BLOCK_SIZE vert_4_bs = get_partition_subsize(bsize, PARTITION_VERT_4);

    assert(horz_4_bs != BLOCK_INVALID);
    assert(vert_4_bs != BLOCK_INVALID);

    av1_setup_src_planes(x, cpi->source, mi_row, mi_col,
                         av1_num_planes(&cpi->common), bsize);
    const int src_stride = x->plane[0].src.stride;
    uint8_t *src = x->plane[0].src.buf;
    const MACROBLOCKD *const xd = &x->e_mbd;

    struct buf_2d horz_4_src, vert_4_src;
    horz_4_src.stride = src_stride;
    vert_4_src.stride = src_stride;

    for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
      horz_4_src.buf = src + i * block_size_high[horz_4_bs] * src_stride;
      vert_4_src.buf = src + i * block_size_wide[vert_4_bs];

      horz_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &horz_4_src, horz_4_bs, AOM_PLANE_Y);
      vert_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &vert_4_src, vert_4_bs, AOM_PLANE_Y);
    }
  }

  const float denom = (float)(pb_source_variance + 1);
  const float low_b = 0.1f;
  const float high_b = 10.0f;
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 4:1 sub-block variance and the whole-block variance.
    float var_ratio = (float)(horz_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 1:4 sub-block RD and the whole-block RD.
    float var_ratio = (float)(vert_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  assert(feature_index == FEATURES);

  // Write features to file
  if (!frame_is_intra_only(&cpi->common)) {
    write_features_to_file(cpi->oxcf.partition_info_path,
                           cpi->ext_part_controller.test_mode, features,
                           FEATURES, 7, bsize, mi_row, mi_col);
  }

  // Calculate scores using the NN model.
  float score[LABELS] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, score);
  int int_score[LABELS];
  int max_score = -1000;
  for (int i = 0; i < LABELS; ++i) {
    int_score[i] = (int)(100 * score[i]);
    max_score = AOMMAX(int_score[i], max_score);
  }

  // Make decisions based on the model scores.
  int thresh = max_score;
  switch (bsize) {
    case BLOCK_16X16: thresh -= 500; break;
    case BLOCK_32X32: thresh -= 500; break;
    case BLOCK_64X64: thresh -= 200; break;
    default: break;
  }
  av1_zero_array(part4_allowed, NUM_PART4_TYPES);
  for (int i = 0; i < LABELS; ++i) {
    if (int_score[i] >= thresh) {
      if ((i >> 0) & 1) part4_allowed[HORZ4] = 1;
      if ((i >> 1) & 1) part4_allowed[VERT4] = 1;
    }
  }
}